

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sp_lev.c
# Opt level: O3

void selection_do_grow(opvar *ov,int dir)

{
  undefined1 *puVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  uint uVar6;
  char cVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  char tmp [80] [21];
  undefined1 *local_6e0;
  uint local_6d0;
  undefined1 local_6c8 [1688];
  
  if (ov->spovartyp == '\t') {
    local_6e0 = local_6c8;
    memset(local_6e0,0,0x690);
    auVar9._0_4_ = -(uint)((dir & 5U) != 0);
    auVar9._4_4_ = -(uint)((dir & 1U) != 0);
    auVar9._8_4_ = -(uint)((dir & 9U) != 0);
    auVar9._12_4_ = -(uint)((dir & 8U) != 0);
    auVar8._0_4_ = -(uint)((dir & 10U) != 0);
    auVar8._4_4_ = -(uint)((dir & 2U) != 0);
    auVar8._8_4_ = -(uint)((dir & 6U) != 0);
    auVar8._12_4_ = -(uint)((dir & 4U) != 0);
    auVar9 = packssdw(auVar8,auVar9);
    auVar9 = packsswb(auVar9,auVar9);
    uVar6 = 0xffffffff;
    lVar2 = 0;
    do {
      local_6d0 = (int)lVar2 - 1;
      lVar4 = lVar2 + 1;
      lVar5 = -1;
      lVar3 = 0;
      do {
        cVar7 = false;
        if ((SUB161(auVar9 >> 0x3f,0) & 1 & lVar2 != 0) != 0) {
          cVar7 = (ov->vardata).str[lVar3 + (ulong)uVar6] != '\x01';
        }
        if (((lVar3 != 0 && (SUB161(auVar9 >> 0x37,0) & 1 & lVar2 != 0) == 1) &&
            (-1 < (int)((uint)lVar5 | local_6d0))) &&
           ((ov->vardata).str[lVar3 + -0x51 + lVar2] != '\x01')) {
          cVar7 = cVar7 + '\x01';
        }
        if (lVar3 != 0 && (SUB161(auVar9 >> 0x2f,0) & 1) == 1) {
          cVar7 = cVar7 + ((ov->vardata).str[lVar3 + -0x50 + lVar2] != '\x01');
        }
        if ((lVar2 != 0x4f) && ((SUB161(auVar9 >> 0x27,0) & 1 & lVar3 != 0) != 0)) {
          cVar7 = cVar7 + ((ov->vardata).str[lVar3 + -0x4f + lVar2] != '\x01');
        }
        if ((SUB161(auVar9 >> 0x1f,0) & 1 & lVar2 != 0x4f) != 0) {
          cVar7 = cVar7 + ((ov->vardata).str[lVar3 + 1 + lVar2] != '\x01');
        }
        if (lVar3 != 0x640 && (SUB161(auVar9 >> 0x17,0) & 1 & lVar2 != 0x4f) == 1) {
          cVar7 = cVar7 + ((ov->vardata).str[lVar3 + 0x51 + lVar2] != '\x01');
        }
        if ((lVar3 != 0x640 && (SUB161(auVar9 >> 0xf,0) & 1) == 1) &&
           ((ov->vardata).str[lVar3 + 0x50 + lVar2] != '\x01')) {
          cVar7 = '\x01';
        }
        if ((((lVar2 != 0) && ((SUB161(auVar9 >> 7,0) & 1 & lVar3 != 0x640) != 0)) &&
            ((ov->vardata).str[lVar3 + 0x4f + lVar2] != '\x01')) || (cVar7 != '\0')) {
          local_6e0[lVar5 + 1] = 1;
        }
        lVar3 = lVar3 + 0x50;
        lVar5 = lVar5 + 1;
      } while (lVar3 != 0x690);
      local_6e0 = local_6e0 + 0x15;
      uVar6 = uVar6 + 1;
      lVar2 = lVar4;
    } while (lVar4 != 0x50);
    puVar1 = local_6c8;
    lVar2 = 0;
    do {
      lVar3 = -0x15;
      lVar4 = lVar2;
      do {
        if ((puVar1[lVar3 + 0x15] != '\0') && (ov->spovartyp == '\t')) {
          (ov->vardata).str[lVar4] = '\x02';
        }
        lVar4 = lVar4 + 0x50;
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0);
      lVar2 = lVar2 + 1;
      puVar1 = puVar1 + 0x15;
    } while (lVar2 != 0x50);
  }
  return;
}

Assistant:

static void selection_do_grow(struct opvar *ov, int dir)
{
	int x, y, c;
	char tmp[COLNO][ROWNO];

	if (ov->spovartyp != SPOVAR_SEL) return;
	if (!ov) return;

	memset(tmp, 0, sizeof(tmp));

	for (x = 0; x < COLNO; x++) {
	    for (y = 0; y < ROWNO; y++) {
		c = 0;
		if ((dir & W_WEST) && x > 0 &&
		    selection_getpoint(x-1, y, ov)) c++;
		if ((dir & (W_WEST|W_NORTH)) && x > 0 && y > 0 &&
		    selection_getpoint(x-1, y-1, ov)) c++;
		if ((dir & W_NORTH) && y > 0 &&
		    selection_getpoint(x, y-1, ov)) c++;
		if ((dir & (W_NORTH|W_EAST)) && y > 0 && x < COLNO-1 &&
		    selection_getpoint(x+1, y-1, ov)) c++;
		if ((dir & W_EAST) && x < COLNO-1 &&
		    selection_getpoint(x+1, y, ov)) c++;
		if ((dir & (W_EAST|W_SOUTH)) && x < COLNO-1 && y < ROWNO-1 &&
		    selection_getpoint(x+1, y+1, ov)) c++;
		if ((dir & W_SOUTH) && y < ROWNO-1 &&
		    selection_getpoint(x, y+1, ov)) c++;
		if ((dir & (W_SOUTH|W_WEST)) && y < ROWNO-1 && x > 0 &&
		    selection_getpoint(x-1, y+1, ov)) c++;
		if (c) tmp[x][y] = 1;
	    }
	}

	for (x = 0; x < COLNO; x++)
	    for (y = 0; y < ROWNO; y++)
		if (tmp[x][y])
		    selection_setpoint(x, y, ov, 1);
}